

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * all_testsuites(void)

{
  char *local_10;
  
  printf("quaternion_all_tests\n");
  test_message = quaternion_all_tests();
  tests_run = tests_run + 1;
  local_10 = test_message;
  if (test_message == (char *)0x0) {
    printf("matrix2_all_tests\n");
    test_message = matrix2_all_tests();
    tests_run = tests_run + 1;
    local_10 = test_message;
    if (test_message == (char *)0x0) {
      printf("matrix3_all_tests\n");
      test_message = matrix3_all_tests();
      tests_run = tests_run + 1;
      local_10 = test_message;
      if (test_message == (char *)0x0) {
        printf("matrix4_all_tests\n");
        test_message = matrix4_all_tests();
        tests_run = tests_run + 1;
        local_10 = test_message;
        if (test_message == (char *)0x0) {
          printf("vector3_all_tests\n");
          test_message = vector3_all_tests();
          tests_run = tests_run + 1;
          local_10 = test_message;
          if (test_message == (char *)0x0) {
            printf("experimental_all_tests\n");
            test_message = experimental_all_tests();
            tests_run = tests_run + 1;
            local_10 = test_message;
            if (test_message == (char *)0x0) {
              local_10 = (char *)0x0;
            }
          }
        }
      }
    }
  }
  return local_10;
}

Assistant:

static char *all_testsuites(void)
{
	printf("quaternion_all_tests\n");
	run_test(quaternion_all_tests);
	printf("matrix2_all_tests\n");
	run_test(matrix2_all_tests);
	printf("matrix3_all_tests\n");
	run_test(matrix3_all_tests);
	printf("matrix4_all_tests\n");
	run_test(matrix4_all_tests);
	printf("vector3_all_tests\n");
	run_test(vector3_all_tests);
	printf("experimental_all_tests\n");
	run_test(experimental_all_tests);

	return NULL;
}